

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralAssignStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          ExpressionSyntax *args_4,Token *args_5)

{
  Token keyword;
  Token semi;
  ProceduralAssignStatementSyntax *pPVar1;
  Info *in_RCX;
  undefined8 *in_R8;
  ExpressionSyntax *in_R9;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  NamedLabelSyntax *in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pPVar1 = (ProceduralAssignStatementSyntax *)
           allocate(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff98);
  keyword.info = (Info *)*in_R8;
  keyword._0_8_ = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000008[1];
  semi.info = in_RCX;
  semi._0_8_ = in_R8;
  slang::syntax::ProceduralAssignStatementSyntax::ProceduralAssignStatementSyntax
            ((ProceduralAssignStatementSyntax *)*in_stack_00000008,
             (SyntaxKind)((ulong)pPVar1 >> 0x20),in_stack_ffffffffffffffa0,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000008[1],keyword,
             in_R9,semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }